

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

void * mriStep_GetLmem(ARKodeMem ark_mem)

{
  void *pvVar1;
  
  if (ark_mem->step_mem == (void *)0x0) {
    pvVar1 = (void *)0x0;
    arkProcessError(ark_mem,-0x15,0x69f,"mriStep_GetLmem",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    pvVar1 = *(void **)((long)ark_mem->step_mem + 0x150);
  }
  return pvVar1;
}

Assistant:

int mriStep_AccessStepMem(ARKodeMem ark_mem, const char* fname,
                          ARKodeMRIStepMem* step_mem)
{
  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_MRISTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  *step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;
  return (ARK_SUCCESS);
}